

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

example * __thiscall VW::ptr_queue<example>::pop(ptr_queue<example> *this)

{
  size_type sVar1;
  reference ppeVar2;
  long in_RDI;
  value_type item;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar3;
  undefined8 local_8;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  while( true ) {
    uVar3 = false;
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      sVar1 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::size
                        ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                         0x299cd3);
      uVar3 = sVar1 == 0;
    }
    if ((bool)uVar3 == false) break;
    std::condition_variable::wait((unique_lock *)(in_RDI + 0xb8));
  }
  if ((*(byte *)(in_RDI + 0x80) & 1) != 0) {
    sVar1 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::size
                      ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                       0x299d1c);
    if (sVar1 == 0) {
      local_8 = (value_type)0x0;
      goto LAB_00299da3;
    }
  }
  ppeVar2 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::front
                      ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                       0x299d47);
  local_8 = *ppeVar2;
  std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::pop
            ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)0x299d58);
  std::unique_lock<std::mutex>::unlock
            ((unique_lock<std::mutex> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
  std::condition_variable::notify_all();
LAB_00299da3:
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
  return local_8;
}

Assistant:

T* pop()
    {
      std::unique_lock<std::mutex> lock(mut);
      while (!done && object_queue.size() == 0)
      {
        is_not_empty.wait(lock);
      }

      if (done && object_queue.size() == 0)
      {
        return nullptr;
      }

      auto item = object_queue.front();
      object_queue.pop();

      lock.unlock();
      is_not_full.notify_all();
      return item;
    }